

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCnf.c
# Opt level: O1

void Ssw_CnfNodeAddToSolver(Ssw_Sat_t *p,Aig_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  Aig_Obj_t *pNode;
  ulong uVar4;
  int iVar5;
  Vec_Ptr_t *vFrontier;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  int in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  long lVar8;
  undefined8 extraout_RDX_01;
  undefined8 uVar9;
  void *pvVar10;
  long lVar11;
  
  pVVar3 = p->vSatVars;
  iVar5 = pObj->Id;
  Vec_IntFillExtra(pVVar3,iVar5 + 1,in_EDX);
  if ((-1 < (long)iVar5) && (iVar5 < pVVar3->nSize)) {
    if (pVVar3->pArray[iVar5] != 0) {
      return;
    }
    vFrontier = (Vec_Ptr_t *)malloc(0x10);
    vFrontier->nCap = 100;
    vFrontier->nSize = 0;
    ppvVar6 = (void **)malloc(800);
    vFrontier->pArray = ppvVar6;
    Ssw_ObjAddToFrontier(p,pObj,vFrontier);
    if (0 < vFrontier->nSize) {
      lVar11 = 0;
      uVar9 = extraout_RDX;
      do {
        pNode = (Aig_Obj_t *)vFrontier->pArray[lVar11];
        pVVar3 = p->vSatVars;
        iVar5 = pNode->Id;
        Vec_IntFillExtra(pVVar3,iVar5 + 1,(int)uVar9);
        if (((long)iVar5 < 0) || (pVVar3->nSize <= iVar5)) goto LAB_005df148;
        if (pVVar3->pArray[iVar5] == 0) {
          __assert_fail("Ssw_ObjSatNum(p,pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswCnf.c"
                        ,0x16e,"void Ssw_CnfNodeAddToSolver(Ssw_Sat_t *, Aig_Obj_t *)");
        }
        iVar5 = Aig_ObjIsMuxType(pNode);
        if (iVar5 == 0) {
          Ssw_CollectSuper(pNode,1,p->vFanins);
          pVVar7 = p->vFanins;
          if (0 < pVVar7->nSize) {
            lVar8 = 0;
            do {
              Ssw_ObjAddToFrontier
                        (p,(Aig_Obj_t *)((ulong)pVVar7->pArray[lVar8] & 0xfffffffffffffffe),
                         vFrontier);
              lVar8 = lVar8 + 1;
              pVVar7 = p->vFanins;
            } while (lVar8 < pVVar7->nSize);
          }
          Ssw_AddClausesSuper(p,pNode,pVVar7);
          uVar9 = extraout_RDX_00;
        }
        else {
          pVVar7 = p->vFanins;
          pVVar7->nSize = 0;
          uVar4 = *(ulong *)(((ulong)pNode->pFanin0 & 0xfffffffffffffffe) + 8);
          if (pVVar7->nCap == 0) {
            if (pVVar7->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar7->pArray,0x80);
            }
            pVVar7->pArray = ppvVar6;
            pVVar7->nCap = 0x10;
          }
          iVar5 = pVVar7->nSize;
          pVVar7->nSize = iVar5 + 1;
          pVVar7->pArray[iVar5] = (void *)(uVar4 & 0xfffffffffffffffe);
          pVVar7 = p->vFanins;
          pvVar10 = (void *)(*(ulong *)(((ulong)pNode->pFanin1 & 0xfffffffffffffffe) + 8) &
                            0xfffffffffffffffe);
          uVar1 = pVVar7->nSize;
          if (0 < (long)(int)uVar1) {
            lVar8 = 0;
            do {
              if (pVVar7->pArray[lVar8] == pvVar10) goto LAB_005def45;
              lVar8 = lVar8 + 1;
            } while ((int)uVar1 != lVar8);
          }
          uVar2 = pVVar7->nCap;
          if (uVar1 == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar7->pArray,0x80);
              }
              pVVar7->pArray = ppvVar6;
              iVar5 = 0x10;
            }
            else {
              iVar5 = uVar2 * 2;
              if (iVar5 <= (int)uVar2) goto LAB_005def2f;
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar7->pArray,(ulong)uVar2 << 4);
              }
              pVVar7->pArray = ppvVar6;
            }
            pVVar7->nCap = iVar5;
          }
LAB_005def2f:
          iVar5 = pVVar7->nSize;
          pVVar7->nSize = iVar5 + 1;
          pVVar7->pArray[iVar5] = pvVar10;
LAB_005def45:
          pVVar7 = p->vFanins;
          pvVar10 = (void *)(*(ulong *)(((ulong)pNode->pFanin0 & 0xfffffffffffffffe) + 0x10) &
                            0xfffffffffffffffe);
          uVar1 = pVVar7->nSize;
          if (0 < (long)(int)uVar1) {
            lVar8 = 0;
            do {
              if (pVVar7->pArray[lVar8] == pvVar10) goto LAB_005df002;
              lVar8 = lVar8 + 1;
            } while ((int)uVar1 != lVar8);
          }
          uVar2 = pVVar7->nCap;
          if (uVar1 == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar7->pArray,0x80);
              }
              pVVar7->pArray = ppvVar6;
              iVar5 = 0x10;
            }
            else {
              iVar5 = uVar2 * 2;
              if (iVar5 <= (int)uVar2) goto LAB_005defec;
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar7->pArray,(ulong)uVar2 << 4);
              }
              pVVar7->pArray = ppvVar6;
            }
            pVVar7->nCap = iVar5;
          }
LAB_005defec:
          iVar5 = pVVar7->nSize;
          pVVar7->nSize = iVar5 + 1;
          pVVar7->pArray[iVar5] = pvVar10;
LAB_005df002:
          pVVar7 = p->vFanins;
          pvVar10 = (void *)(*(ulong *)(((ulong)pNode->pFanin1 & 0xfffffffffffffffe) + 0x10) &
                            0xfffffffffffffffe);
          uVar1 = pVVar7->nSize;
          if (0 < (long)(int)uVar1) {
            lVar8 = 0;
            do {
              if (pVVar7->pArray[lVar8] == pvVar10) goto LAB_005df0bf;
              lVar8 = lVar8 + 1;
            } while ((int)uVar1 != lVar8);
          }
          uVar2 = pVVar7->nCap;
          if (uVar1 == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar7->pArray,0x80);
              }
              pVVar7->pArray = ppvVar6;
              iVar5 = 0x10;
            }
            else {
              iVar5 = uVar2 * 2;
              if (iVar5 <= (int)uVar2) goto LAB_005df0a9;
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
              }
              else {
                ppvVar6 = (void **)realloc(pVVar7->pArray,(ulong)uVar2 << 4);
              }
              pVVar7->pArray = ppvVar6;
            }
            pVVar7->nCap = iVar5;
          }
LAB_005df0a9:
          iVar5 = pVVar7->nSize;
          pVVar7->nSize = iVar5 + 1;
          pVVar7->pArray[iVar5] = pvVar10;
LAB_005df0bf:
          pVVar7 = p->vFanins;
          if (0 < pVVar7->nSize) {
            lVar8 = 0;
            do {
              Ssw_ObjAddToFrontier
                        (p,(Aig_Obj_t *)((ulong)pVVar7->pArray[lVar8] & 0xfffffffffffffffe),
                         vFrontier);
              lVar8 = lVar8 + 1;
              pVVar7 = p->vFanins;
            } while (lVar8 < pVVar7->nSize);
          }
          Ssw_AddClausesMux(p,pNode);
          uVar9 = extraout_RDX_01;
        }
        if (p->vFanins->nSize < 2) {
          __assert_fail("Vec_PtrSize(p->vFanins) > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswCnf.c"
                        ,0x181,"void Ssw_CnfNodeAddToSolver(Ssw_Sat_t *, Aig_Obj_t *)");
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < vFrontier->nSize);
    }
    if (vFrontier->pArray != (void **)0x0) {
      free(vFrontier->pArray);
      vFrontier->pArray = (void **)0x0;
    }
    free(vFrontier);
    return;
  }
LAB_005df148:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Ssw_CnfNodeAddToSolver( Ssw_Sat_t * p, Aig_Obj_t * pObj )
{
    Vec_Ptr_t * vFrontier;
    Aig_Obj_t * pNode, * pFanin;
    int i, k, fUseMuxes = 1;
    // quit if CNF is ready
    if ( Ssw_ObjSatNum(p,pObj) )
        return;
    // start the frontier
    vFrontier = Vec_PtrAlloc( 100 );
    Ssw_ObjAddToFrontier( p, pObj, vFrontier );
    // explore nodes in the frontier
    Vec_PtrForEachEntry( Aig_Obj_t *, vFrontier, pNode, i )
    {
        // create the supergate
        assert( Ssw_ObjSatNum(p,pNode) );
        if ( fUseMuxes && Aig_ObjIsMuxType(pNode) )
        {
            Vec_PtrClear( p->vFanins );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin0( Aig_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin0( Aig_ObjFanin1(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin1( Aig_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin1( Aig_ObjFanin1(pNode) ) );
            Vec_PtrForEachEntry( Aig_Obj_t *, p->vFanins, pFanin, k )
                Ssw_ObjAddToFrontier( p, Aig_Regular(pFanin), vFrontier );
            Ssw_AddClausesMux( p, pNode );
        }
        else
        {
            Ssw_CollectSuper( pNode, fUseMuxes, p->vFanins );
            Vec_PtrForEachEntry( Aig_Obj_t *, p->vFanins, pFanin, k )
                Ssw_ObjAddToFrontier( p, Aig_Regular(pFanin), vFrontier );
            Ssw_AddClausesSuper( p, pNode, p->vFanins );
        }
        assert( Vec_PtrSize(p->vFanins) > 1 );
    }
    Vec_PtrFree( vFrontier );
}